

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::mirror(CImg<unsigned_char> *this,char axis)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  void *__dest;
  long lVar4;
  CImgArgumentException *this_00;
  byte bVar5;
  uint uVar6;
  uchar *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  uchar *__src;
  
  __src = this->_data;
  if (__src != (uchar *)0x0) {
    uVar6 = this->_width;
    uVar12 = (ulong)uVar6;
    if (uVar6 != 0) {
      uVar9 = this->_height;
      if (uVar9 != 0) {
        uVar8 = this->_depth;
        if ((uVar8 != 0) && (this->_spectrum != 0)) {
          bVar5 = axis + 0x20;
          if ((byte)(axis + 0xa5U) < 0xe6) {
            bVar5 = axis;
          }
          if (bVar5 < 0x79) {
            if (bVar5 == 99) {
              uVar12 = uVar9 * uVar12 * (ulong)uVar8;
              __dest = operator_new__(uVar12);
              uVar6 = this->_spectrum;
              if (1 < uVar6) {
                uVar9 = uVar6 >> 1;
                puVar7 = __src + uVar12 * (uVar6 - 1);
                do {
                  uVar12 = (ulong)(this->_height * this->_width * this->_depth);
                  memcpy(__dest,__src,uVar12);
                  memcpy(__src,puVar7,uVar12);
                  memcpy(puVar7,__dest,(ulong)(this->_height * this->_width * this->_depth));
                  lVar4 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
                  __src = __src + lVar4;
                  puVar7 = puVar7 + -lVar4;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
              }
            }
            else {
              if (bVar5 != 0x78) {
LAB_001a619a:
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar11 = "non-";
                if (this->_is_shared != false) {
                  pcVar11 = "";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::mirror(): Invalid specified axis \'%c\'."
                           ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                           (ulong)this->_spectrum,this->_data,pcVar11,"unsigned char",
                           (ulong)(uint)(int)axis);
                __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
              }
              __dest = (void *)0x0;
              if (this->_depth * this->_height * this->_spectrum != 0) {
                uVar9 = uVar6 >> 1;
                puVar7 = __src + (uVar6 - 1);
                uVar8 = 0;
                do {
                  uVar10 = uVar9;
                  if (1 < uVar6) {
                    do {
                      uVar1 = *__src;
                      *__src = *puVar7;
                      __src = __src + 1;
                      *puVar7 = uVar1;
                      puVar7 = puVar7 + -1;
                      uVar10 = uVar10 - 1;
                    } while (uVar10 != 0);
                  }
                  __src = __src + (this->_width - uVar9);
                  puVar7 = puVar7 + (this->_width + uVar9);
                  uVar8 = uVar8 + 1;
                } while (uVar8 < this->_depth * this->_height * this->_spectrum);
              }
            }
          }
          else if (bVar5 == 0x79) {
            __dest = operator_new__(uVar12);
            if (this->_spectrum * this->_depth != 0) {
              uVar8 = uVar9 >> 1;
              puVar7 = __src + (uVar9 - 1) * uVar12;
              uVar6 = 0;
              do {
                uVar10 = uVar8;
                if (1 < uVar9) {
                  do {
                    uVar2 = this->_width;
                    memcpy(__dest,__src,(ulong)uVar2);
                    memcpy(__src,puVar7,(ulong)uVar2);
                    memcpy(puVar7,__dest,(ulong)this->_width);
                    __src = __src + this->_width;
                    puVar7 = puVar7 + -(ulong)this->_width;
                    uVar10 = uVar10 - 1;
                  } while (uVar10 != 0);
                }
                __src = __src + (ulong)(this->_height - uVar8) * (ulong)this->_width;
                puVar7 = puVar7 + (ulong)(this->_height + uVar8) * (ulong)this->_width;
                uVar6 = uVar6 + 1;
              } while (uVar6 < this->_spectrum * this->_depth);
            }
          }
          else {
            if (bVar5 != 0x7a) goto LAB_001a619a;
            uVar12 = uVar9 * uVar12;
            __dest = operator_new__(uVar12);
            if (0 < (int)this->_spectrum) {
              uVar6 = uVar8 >> 1;
              puVar7 = __src + uVar12 * (uVar8 - 1);
              iVar3 = 0;
              do {
                uVar9 = uVar6;
                if (1 < uVar8) {
                  do {
                    uVar12 = (ulong)(this->_height * this->_width);
                    memcpy(__dest,__src,uVar12);
                    memcpy(__src,puVar7,uVar12);
                    memcpy(puVar7,__dest,(ulong)(this->_height * this->_width));
                    lVar4 = (ulong)this->_height * (ulong)this->_width;
                    __src = __src + lVar4;
                    puVar7 = puVar7 + -lVar4;
                    uVar9 = uVar9 - 1;
                  } while (uVar9 != 0);
                }
                lVar4 = (ulong)this->_height * (ulong)this->_width;
                __src = __src + (ulong)(this->_depth - uVar6) * lVar4;
                puVar7 = puVar7 + (ulong)(this->_depth + uVar6) * lVar4;
                iVar3 = iVar3 + 1;
              } while (iVar3 < (int)this->_spectrum);
            }
          }
          if (__dest != (void *)0x0) {
            operator_delete__(__dest);
          }
        }
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& mirror(const char axis) {
      if (is_empty()) return *this;
      T *pf, *pb, *buf = 0;
      switch (cimg::lowercase(axis)) {
      case 'x' : {
        pf = _data; pb = data(_width - 1);
        const unsigned int width2 = _width/2;
        for (unsigned int yzv = 0; yzv<_height*_depth*_spectrum; ++yzv) {
          for (unsigned int x = 0; x<width2; ++x) { const T val = *pf; *(pf++) = *pb; *(pb--) = val; }
          pf+=_width - width2;
          pb+=_width + width2;
        }
      } break;
      case 'y' : {
        buf = new T[_width];
        pf = _data; pb = data(0,_height - 1);
        const unsigned int height2 = _height/2;
        for (unsigned int zv = 0; zv<_depth*_spectrum; ++zv) {
          for (unsigned int y = 0; y<height2; ++y) {
            std::memcpy(buf,pf,_width*sizeof(T));
            std::memcpy(pf,pb,_width*sizeof(T));
            std::memcpy(pb,buf,_width*sizeof(T));
            pf+=_width;
            pb-=_width;
          }
          pf+=(ulongT)_width*(_height - height2);
          pb+=(ulongT)_width*(_height + height2);
        }
      } break;
      case 'z' : {
        buf = new T[(ulongT)_width*_height];
        pf = _data; pb = data(0,0,_depth - 1);
        const unsigned int depth2 = _depth/2;
        cimg_forC(*this,c) {
          for (unsigned int z = 0; z<depth2; ++z) {
            std::memcpy(buf,pf,_width*_height*sizeof(T));
            std::memcpy(pf,pb,_width*_height*sizeof(T));
            std::memcpy(pb,buf,_width*_height*sizeof(T));
            pf+=(ulongT)_width*_height;
            pb-=(ulongT)_width*_height;
          }
          pf+=(ulongT)_width*_height*(_depth - depth2);
          pb+=(ulongT)_width*_height*(_depth + depth2);
        }
      } break;
      case 'c' : {
        buf = new T[(ulongT)_width*_height*_depth];
        pf = _data; pb = data(0,0,0,_spectrum - 1);
        const unsigned int _spectrum2 = _spectrum/2;
        for (unsigned int v = 0; v<_spectrum2; ++v) {
          std::memcpy(buf,pf,_width*_height*_depth*sizeof(T));
          std::memcpy(pf,pb,_width*_height*_depth*sizeof(T));
          std::memcpy(pb,buf,_width*_height*_depth*sizeof(T));
          pf+=(ulongT)_width*_height*_depth;
          pb-=(ulongT)_width*_height*_depth;
        }
      } break;
      default :
        throw CImgArgumentException(_cimg_instance
                                    "mirror(): Invalid specified axis '%c'.",
                                    cimg_instance,
                                    axis);
      }
      delete[] buf;
      return *this;
    }